

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O3

void __thiscall
CppGenerator::registerAggregatesToLoops(CppGenerator *this,size_t depth,size_t group_id)

{
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *this_00;
  pointer pbVar1;
  TreeDecomposition *this_01;
  pointer pbVar2;
  pointer pvVar3;
  pointer pPVar4;
  pointer ppVar5;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var6;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var7;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var8;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var9;
  _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
  *p_Var10;
  _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
  *p_Var11;
  pointer pvVar12;
  pointer pvVar13;
  ProductAggregate *pPVar14;
  View *pVVar15;
  TDNode *pTVar16;
  size_t sVar17;
  pointer pPVar18;
  pointer pdVar19;
  long lVar20;
  long lVar21;
  ulong *puVar22;
  pointer ppVar23;
  ulong *puVar24;
  long lVar25;
  ulong uVar26;
  ProductAggregate *prodAgg;
  _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_02;
  _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
  *this_03;
  ProductAggregate *prodAgg_00;
  _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_04;
  pointer this_05;
  byte bVar27;
  pair<unsigned_long,_unsigned_long> pVar28;
  bool loopsOverRelation;
  size_t maxDepth;
  dyn_bitset contributingViews;
  dyn_bitset consideredLoops;
  dyn_bitset prefixLoops;
  dyn_bitset nextVariable;
  size_t currentLoop;
  prod_bitset presentFunctions;
  _Base_bitset<24UL> in_stack_fffffffffffffcc8;
  bool local_261;
  long local_260;
  size_t local_258;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_250;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_230;
  dyn_bitset local_210;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_1f0;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_1d0;
  prod_bitset local_1b0;
  ulong local_f0 [24];
  
  bVar27 = 0;
  pbVar1 = (this->groupVariableOrderBitset).
           super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_258 = (long)this->groupVariableOrder[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)this->groupVariableOrder[group_id].
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
  this_01 = (this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pVVar15 = QueryCompiler::getView
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,*(this->viewGroups).
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[group_id].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start);
  pTVar16 = TreeDecomposition::getRelation(this_01,(ulong)pVVar15->_origin);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(&this->listOfLoops);
  pbVar2 = (this->functionsPerLoop).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->functionsPerLoop).
      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar2) {
    (this->functionsPerLoop).
    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar2;
  }
  pbVar2 = (this->functionsPerLoopBranch).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->functionsPerLoopBranch).
      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pbVar2) {
    (this->functionsPerLoopBranch).
    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pbVar2;
  }
  this_00 = &this->viewsPerLoop;
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(this_00);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::clear(&this->nextLoopsPerLoop);
  memset(local_f0,0,0xc0);
  sVar17 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_250,sVar17 + 1,0,(allocator<unsigned_long> *)&local_1b0);
  pvVar3 = (this->productToVariableRegister).
           super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_260 = depth * 3;
  pPVar4 = *(pointer *)
            ((long)&pvVar3[depth].
                    super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>._M_impl.
                    super__Vector_impl_data + 8);
  for (pPVar18 = pvVar3[depth].
                 super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>._M_impl.
                 super__Vector_impl_data._M_start; pPVar18 != pPVar4; pPVar18 = pPVar18 + 1) {
    lVar20 = 0;
    do {
      puVar22 = (ulong *)((long)(pPVar18->product).super__Base_bitset<24UL>._M_w + lVar20 * 8);
      uVar26 = puVar22[1];
      local_f0[lVar20] = local_f0[lVar20] | *puVar22;
      local_f0[lVar20 + 1] = local_f0[lVar20 + 1] | uVar26;
      lVar20 = lVar20 + 2;
    } while (lVar20 != 0x18);
    ppVar5 = *(pointer *)
              ((long)&(pPVar18->viewAggregate).
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl + 8);
    for (ppVar23 = (pPVar18->viewAggregate).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar23 != ppVar5;
        ppVar23 = ppVar23 + 1) {
      local_250.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[ppVar23->first >> 6] =
           local_250.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[ppVar23->first >> 6] |
           1L << ((byte)ppVar23->first & 0x3f);
    }
  }
  sVar17 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_230,sVar17 + 1,0,(allocator<unsigned_long> *)&local_1b0);
  sVar17 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_1d0,sVar17 + 1,0,(allocator<unsigned_long> *)&local_1b0);
  sVar17 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_1f0,sVar17 + 1,0,(allocator<unsigned_long> *)&local_1b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_210.m_bits,&local_230.m_bits);
  local_210.m_num_bits = local_230.m_num_bits;
  puVar22 = local_f0;
  puVar24 = (ulong *)&stack0xfffffffffffffcc8;
  for (lVar20 = 0x18; lVar20 != 0; lVar20 = lVar20 + -1) {
    *puVar24 = *puVar22;
    puVar22 = puVar22 + (ulong)bVar27 * -2 + 1;
    puVar24 = puVar24 + (ulong)bVar27 * -2 + 1;
  }
  computeLoopMasks(&local_1b0,this,(prod_bitset)in_stack_fffffffffffffcc8._M_w,&local_210,
                   pbVar1 + group_id,&pTVar16->_bag,&local_250,&local_1d0,&local_1f0);
  if (local_210.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pdVar19 = (this_00->
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  lVar20 = *(long *)&(pdVar19->m_bits).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
  lVar21 = (long)*(pointer *)
                  ((long)&(pdVar19->m_bits).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  + 8) - lVar20;
  if (lVar21 != 0) {
    lVar21 = lVar21 >> 3;
    lVar25 = 0;
    do {
      puVar22 = (ulong *)(lVar20 + lVar25 * 8);
      *puVar22 = *puVar22 |
                 local_250.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar25];
      lVar25 = lVar25 + 1;
    } while (lVar21 + (ulong)(lVar21 == 0) != lVar25);
  }
  if (0x20 < (ulong)((long)(this->viewsPerLoop).
                           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar19)) {
    uVar26 = 1;
    do {
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b0,
                 pdVar19 + uVar26);
      pdVar19 = (this_00->
                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar20 = *(long *)&(pdVar19->m_bits).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl;
      lVar21 = (long)*(pointer *)
                      ((long)&(pdVar19->m_bits).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl + 8) - lVar20;
      if (lVar21 == 0) {
        if ((pointer)local_1b0.super__Base_bitset<24UL>._M_w[0] != (pointer)0x0) goto LAB_0024090d;
      }
      else {
        lVar21 = lVar21 >> 3;
        lVar25 = 0;
        do {
          puVar22 = (ulong *)(lVar20 + lVar25 * 8);
          *puVar22 = *puVar22 & *(ulong *)(local_1b0.super__Base_bitset<24UL>._M_w[0] + lVar25 * 8);
          lVar25 = lVar25 + 1;
        } while (lVar21 + (ulong)(lVar21 == 0) != lVar25);
LAB_0024090d:
        operator_delete((void *)local_1b0.super__Base_bitset<24UL>._M_w[0]);
        pdVar19 = (this_00->
                  super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 < (ulong)((long)(this->viewsPerLoop).
                                    super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar19 >> 5)
            );
  }
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::clear(&this->newAggregateRegister);
  p_Var6 = &((this->aggregateRegisterMap).
             super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var7 = &((this->aggregateRegisterMap).
             super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_04 = p_Var6;
  if (p_Var7 != p_Var6) {
    do {
      std::
      _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != p_Var7);
    (this->aggregateRegisterMap).
    super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var6;
  }
  std::
  vector<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
  ::resize(&this->newAggregateRegister,
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::
  vector<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
  ::resize(&this->aggregateRegisterMap,
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  p_Var8 = &((this->localProductMap).
             super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_h;
  p_Var9 = &((this->localProductMap).
             super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_h;
  this_02 = p_Var8;
  if (p_Var9 != p_Var8) {
    do {
      std::
      _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != p_Var9);
    (this->localProductMap).
    super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var8;
  }
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::clear(&this->localProductList);
  std::
  vector<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
  ::resize(&this->localProductList,
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::
  vector<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
  ::resize(&this->localProductMap,
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  p_Var10 = &((this->viewProductMap).
              super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  p_Var11 = &((this->viewProductMap).
              super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_03 = p_Var10;
  if (p_Var11 != p_Var10) {
    do {
      std::
      _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
      ::~_Rb_tree(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != p_Var11);
    (this->viewProductMap).
    super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var10;
  }
  pvVar12 = (this->viewProductList).
            super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar13 = (this->viewProductList).
            super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  this_05 = pvVar12;
  if (pvVar13 != pvVar12) {
    do {
      std::
      vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
      ::~vector(this_05);
      this_05 = this_05 + 1;
    } while (this_05 != pvVar13);
    (this->viewProductList).
    super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar12;
  }
  std::
  vector<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
  ::resize(&this->viewProductList,
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::
  vector<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
  ::resize(&this->viewProductMap,
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->listOfLoops).
                 super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5);
  pvVar3 = (this->productToVariableRegister).
           super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  prodAgg_00 = *(ProductAggregate **)
                ((long)&(pvVar3->
                        super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>).
                        _M_impl.super__Vector_impl_data + local_260 * 8);
  pPVar14 = *(ProductAggregate **)
             ((long)&(pvVar3->
                     super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>).
                     _M_impl.super__Vector_impl_data + local_260 * 8 + 8);
  if (prodAgg_00 != pPVar14) {
    do {
      local_1b0.super__Base_bitset<24UL>._M_w[0] = 0;
      local_261 = false;
      pVar28 = addProductToLoop(this,prodAgg_00,(size_t *)&local_1b0,&local_261,&local_258);
      prodAgg_00->correspondingLoopAgg = pVar28;
      prodAgg_00 = prodAgg_00 + 1;
    } while (prodAgg_00 != pPVar14);
  }
  if (local_1f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_1d0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_230.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_230.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_250.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CppGenerator::registerAggregatesToLoops(size_t depth, size_t group_id)
{
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    const size_t maxDepth = groupVariableOrder[group_id].size();
    const var_bitset& relationBag =
        _td->getRelation(_qc->getView(viewGroups[group_id][0])->_origin)->_bag;

    listOfLoops.clear();
    functionsPerLoop.clear();
    functionsPerLoopBranch.clear();
    viewsPerLoop.clear();
    nextLoopsPerLoop.clear();

    // go through the ProductAggregates and find functions computed here 
    prod_bitset presentFunctions;    
    dyn_bitset contributingViews(_qc->numberOfViews()+1);
    for (const ProductAggregate& prodAgg : productToVariableRegister[depth])
    {
        presentFunctions |= prodAgg.product;
        for (const std::pair<size_t,size_t>& p : prodAgg.viewAggregate)
            contributingViews.set(p.first);
    }

    /*************** PRINT OUT **************/
    // const TDNode& node =
    //     *_td->getRelation(_qc->getView(viewGroups[group_id][0])->_origin);
    // std::cout << genProductString(node,contributingViews,presentFunctions)<<std::endl;
    /*************** PRINT OUT **************/
    
    dyn_bitset consideredLoops(_qc->numberOfViews()+1);
    dyn_bitset nextVariable(_qc->numberOfViews()+1);
    dyn_bitset prefixLoops(_qc->numberOfViews()+1);

    // compute the function mask for each loop 
    computeLoopMasks(presentFunctions, consideredLoops, varOrderBitset,
                     relationBag, contributingViews, nextVariable, prefixLoops);

    
    // The first register loop should all views that we do not iterate over! 
    viewsPerLoop[0] |= contributingViews;
    for (size_t j = 1; j < viewsPerLoop.size(); ++j)
        viewsPerLoop[0] &= ~viewsPerLoop[j];
    
    newAggregateRegister.clear();
    aggregateRegisterMap.clear();
    newAggregateRegister.resize(listOfLoops.size());
    aggregateRegisterMap.resize(listOfLoops.size());

    localProductMap.clear();
    localProductList.clear();
    localProductList.resize(listOfLoops.size());
    localProductMap.resize(listOfLoops.size());

    viewProductMap.clear();
    viewProductList.clear();
    viewProductList.resize(listOfLoops.size());
    viewProductMap.resize(listOfLoops.size());
    
    for(ProductAggregate& prodAgg : productToVariableRegister[depth])
    {    
        size_t currentLoop = 0;
        bool loopsOverRelation = false;
        prodAgg.correspondingLoopAgg =
            addProductToLoop(prodAgg, currentLoop, loopsOverRelation, maxDepth);
    }
}